

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReader.h
# Opt level: O1

ssize_t __thiscall FileReader::write(FileReader *this,int __fd,void *__buf,size_t __n)

{
  void *pvVar1;
  posixerror *this_00;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->_state == STATE_READING) {
    flush(this);
  }
  this->_state = STATE_WRITING;
  pvVar1 = (void *)fwrite((void *)CONCAT44(in_register_00000034,__fd),1,(size_t)__buf,
                          (FILE *)this->_f);
  if (__buf <= pvVar1) {
    return (ssize_t)pvVar1;
  }
  this_00 = (posixerror *)__cxa_allocate_exception(0x28);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"writing ","");
  std::operator+(&local_40,&local_60,&this->_filename);
  posixerror::posixerror(this_00,&local_40);
  __cxa_throw(this_00,&posixerror::typeinfo,posixerror::~posixerror);
}

Assistant:

virtual void write(const uint8_t *p, size_t n)
    {
        if (_state==STATE_READING)
            flush();
        _state= STATE_WRITING;
        //printf("writing %p  [%p, %x]\n", _f, p, n);
        size_t r= fwrite(p, 1, n, _f);
        if (r<n)
            throw posixerror(std::string("writing ")+_filename);
    }